

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringHelpers.cpp
# Opt level: O1

int StringHelpers::stringToNumber(string *s)

{
  int iVar1;
  long *plVar2;
  int result;
  istringstream convert;
  int local_18c;
  istringstream local_188 [120];
  ios_base local_110 [264];
  
  std::__cxx11::istringstream::istringstream(local_188,(string *)s,_S_in);
  plVar2 = (long *)std::istream::operator>>((istream *)local_188,&local_18c);
  if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) {
    local_18c = 0;
  }
  iVar1 = local_18c;
  std::__cxx11::istringstream::~istringstream(local_188);
  std::ios_base::~ios_base(local_110);
  return iVar1;
}

Assistant:

int StringHelpers::stringToNumber(string s)
{
	istringstream convert(s);
	int result;
	if (!(convert >> result))
	{
		result = 0;
	}
	return result;
}